

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

Vec3 vneg(Vec3 v)

{
  Vec3 VVar1;
  ulong uVar2;
  Vec3 v_local;
  
  uVar2 = v._0_8_ ^ 0x8000000080000000;
  VVar1.z = -v.z;
  VVar1.x = (float)(int)uVar2;
  VVar1.y = (float)(int)(uVar2 >> 0x20);
  return VVar1;
}

Assistant:

static inline Vec3 vneg(Vec3 v) {
    return (Vec3) {
        - v.x,
            - v.y,
            - v.z
            };
}